

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-test.c++
# Opt level: O3

Own<kj::Directory> __thiscall kj::anon_unknown_0::TempDir::get(TempDir *this)

{
  int iVar1;
  Disposer *extraout_RAX;
  Directory *extraout_RDX;
  undefined8 *in_RSI;
  char *__file;
  Own<kj::Directory> OVar2;
  Fault f;
  AutoCloseFd local_48;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  do {
    __file = "";
    if (in_RSI[1] != 0) {
      __file = (char *)*in_RSI;
    }
    local_48.fd = open(__file,0);
    if (-1 < local_48.fd) goto LAB_00249715;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_40.exception = (Exception *)0x0;
    local_38 = 0;
    uStack_30 = 0;
    _::Debug::Fault::init
              (&local_40,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
              );
    _::Debug::Fault::fatal(&local_40);
  }
LAB_00249715:
  UnwindDetector::UnwindDetector(&local_48.unwindDetector);
  newDiskDirectory((kj *)this,&local_48);
  AutoCloseFd::~AutoCloseFd(&local_48);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = extraout_RAX;
  return OVar2;
}

Assistant:

Own<Directory> get() {
    int fd;
    KJ_SYSCALL(fd = open(filename.cStr(), O_RDONLY));
    return newDiskDirectory(AutoCloseFd(fd));
  }